

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

led * __thiscall ev3dev::led::set_trigger(led *this,string *v)

{
  led *in_RDX;
  led *in_RDI;
  device *in_stack_00000070;
  led *this_00;
  allocator local_39;
  string local_38 [56];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"trigger",&local_39);
  device::set_attr_string(in_stack_00000070,(string *)this,v);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  led(this_00,in_RDX);
  return in_RDI;
}

Assistant:

led set_trigger(std::string v) {
            set_attr_string("trigger", v);
            return *this;
        }